

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

array_container_t * array_container_from_bitset(bitset_container_t *bits)

{
  uint uVar1;
  array_container_t *paVar2;
  int32_t *in_RDI;
  uint16_t *unaff_retaddr;
  array_container_t *result;
  uint16_t in_stack_00000536;
  size_t in_stack_00000538;
  uint16_t *in_stack_00000540;
  size_t in_stack_00000548;
  uint64_t *in_stack_00000550;
  int32_t in_stack_ffffffffffffffec;
  
  paVar2 = array_container_create_given_capacity(in_stack_ffffffffffffffec);
  paVar2->cardinality = *in_RDI;
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    bitset_extract_setbits_uint16
              ((uint64_t *)bits,(size_t)result,unaff_retaddr,(uint16_t)((ulong)in_RDI >> 0x30));
  }
  else {
    bitset_extract_setbits_avx512_uint16
              (in_stack_00000550,in_stack_00000548,in_stack_00000540,in_stack_00000538,
               in_stack_00000536);
  }
  return paVar2;
}

Assistant:

array_container_t *array_container_from_bitset(const bitset_container_t *bits) {
    array_container_t *result =
        array_container_create_given_capacity(bits->cardinality);
    result->cardinality = bits->cardinality;
#if CROARING_IS_X64
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        bitset_extract_setbits_avx512_uint16(
            bits->words, BITSET_CONTAINER_SIZE_IN_WORDS, result->array,
            bits->cardinality, 0);
    } else
#endif
    {
        //  sse version ends up being slower here
        // (bitset_extract_setbits_sse_uint16)
        // because of the sparsity of the data
        bitset_extract_setbits_uint16(
            bits->words, BITSET_CONTAINER_SIZE_IN_WORDS, result->array, 0);
    }
#else
    // If the system is not x64, then we have no accelerated function.
    bitset_extract_setbits_uint16(bits->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  result->array, 0);
#endif

    return result;
}